

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.hh
# Opt level: O3

void __thiscall SSM::DeviceException::DeviceException(DeviceException *this,string *msg)

{
  pointer pcVar1;
  string local_38;
  
  pcVar1 = (msg->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + msg->_M_string_length);
  Exception::Exception(&this->super_Exception,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&this->super_Exception = &PTR__Exception_00108d08;
  return;
}

Assistant:

DeviceException(std::string msg) : Exception(msg) {}